

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# power.c
# Opt level: O1

int envy_bios_parse_power_unk6c(envy_bios *bios)

{
  byte bVar1;
  byte bVar2;
  int iVar3;
  envy_bios_power_unk6c_entry *peVar4;
  uint32_t uVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  int iVar9;
  
  uVar6 = (bios->power).unk6c.offset;
  iVar9 = -0x16;
  if ((ulong)uVar6 != 0) {
    if (uVar6 < bios->length) {
      (bios->power).unk6c.version = bios->data[uVar6];
    }
    else {
      (bios->power).unk6c.version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
    }
    if ((bios->power).unk6c.version == '\x10') {
      uVar6 = (bios->power).unk6c.offset + 1;
      if (uVar6 < bios->length) {
        (bios->power).unk6c.hlen = bios->data[uVar6];
        iVar9 = 0;
      }
      else {
        (bios->power).unk6c.hlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar9 = -0xe;
      }
      uVar6 = (bios->power).unk6c.offset + 2;
      if (uVar6 < bios->length) {
        (bios->power).unk6c.rlen = bios->data[uVar6];
        iVar7 = 0;
      }
      else {
        (bios->power).unk6c.rlen = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar7 = -0xe;
      }
      uVar6 = (bios->power).unk6c.offset + 3;
      if (uVar6 < bios->length) {
        (bios->power).unk6c.entriesnum = bios->data[uVar6];
        iVar3 = 0;
      }
      else {
        (bios->power).unk6c.entriesnum = '\0';
        fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
        iVar3 = -0xe;
      }
      (bios->power).unk6c.valid = (iVar7 == 0 && iVar9 == 0) && iVar3 == 0;
      bVar1 = (bios->power).unk6c.entriesnum;
      peVar4 = (envy_bios_power_unk6c_entry *)malloc((ulong)((uint)bVar1 * 4));
      (bios->power).unk6c.entries = peVar4;
      if (bVar1 == 0) {
        iVar9 = 0;
      }
      else {
        uVar5 = (uint)(bios->power).unk6c.hlen + (bios->power).unk6c.offset;
        bVar2 = (bios->power).unk6c.rlen;
        iVar9 = 0;
        uVar8 = 0;
        do {
          peVar4[uVar8].offset = uVar5;
          uVar8 = uVar8 + 1;
          uVar5 = uVar5 + bVar2;
        } while (bVar1 != uVar8);
      }
    }
    else {
      fprintf(_stderr,"Unknown VOLTAGE DEVICE table version 0x%x\n");
    }
  }
  return iVar9;
}

Assistant:

int envy_bios_parse_power_unk6c(struct envy_bios *bios) {
	struct envy_bios_power_unk6c *unk6c = &bios->power.unk6c;
	int i, err = 0;

	if (!unk6c->offset)
		return -EINVAL;

	bios_u8(bios, unk6c->offset + 0x0, &unk6c->version);
	switch(unk6c->version) {
	case 0x10:
		err |= bios_u8(bios, unk6c->offset + 0x1, &unk6c->hlen);
		err |= bios_u8(bios, unk6c->offset + 0x2, &unk6c->rlen);
		err |= bios_u8(bios, unk6c->offset + 0x3, &unk6c->entriesnum);
		unk6c->valid = !err;
		break;
	default:
		ENVY_BIOS_ERR("Unknown VOLTAGE DEVICE table version 0x%x\n", unk6c->version);
		return -EINVAL;
	};

	err = 0;
	unk6c->entries = malloc(unk6c->entriesnum * sizeof(struct envy_bios_power_unk6c_entry));
	for (i = 0; i < unk6c->entriesnum; i++) {
		uint32_t data = unk6c->offset + unk6c->hlen + i * unk6c->rlen;

		unk6c->entries[i].offset = data;
	}

	return 0;
}